

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo5.cpp
# Opt level: O1

int64_t primesum::pi_lmo5(int64_t x)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  double dVar3;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  int256_t res;
  int128_t *piVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int128_t *piVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int128_t *piVar12;
  ulong uVar13;
  long r;
  long lVar14;
  uint64_t x_04;
  ulong uVar15;
  long lVar16;
  uint64_t uVar17;
  size_t size;
  uint64_t c;
  int64_t iVar18;
  uint64_t low;
  BitSieve sieve;
  vector<int,_std::allocator<int>_> primes;
  vector<long,_std::allocator<long>_> phi;
  size_type __dnew;
  vector<int,_std::allocator<int>_> pi;
  Wheel wheel;
  vector<int,_std::allocator<int>_> lpf;
  vector<int,_std::allocator<int>_> mu;
  int256_t s1;
  int256_t p2;
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  string local_1e8;
  double local_1c8;
  long local_1c0;
  uint64_t local_1b8;
  uint64_t local_1b0;
  long local_1a8;
  long local_1a0;
  vector<int,_std::allocator<int>_> local_198;
  long local_180;
  int128_t *local_178;
  long local_170;
  vector<long,_std::allocator<long>_> local_168;
  string local_150;
  vector<int,_std::allocator<int>_> local_130;
  Wheel local_118;
  double local_100;
  size_t local_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  int128_t *local_e0;
  long local_d8;
  pointer local_d0;
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  long local_98;
  long lStack_90;
  long local_88;
  long lStack_80;
  int256_t local_78;
  int256_t local_58;
  
  if (x < 2) {
    iVar18 = 0;
  }
  else {
    x_00._8_8_ = in_stack_fffffffffffffe00;
    x_00._0_8_ = in_stack_fffffffffffffdf8;
    local_1c8 = get_alpha_lmo((primesum *)x,(int128_t)x_00);
    dVar3 = pow((double)x,0.3333333333333333);
    lVar9 = (long)dVar3;
    if (0 < lVar9) {
      do {
        lVar14 = 1;
        iVar5 = 2;
        do {
          lVar14 = lVar14 * lVar9;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        if (lVar14 - x / lVar9 == 0 || lVar14 < x / lVar9) goto LAB_0012081c;
        bVar2 = 1 < lVar9;
        lVar9 = lVar9 + -1;
      } while (bVar2);
      lVar9 = 0;
    }
LAB_0012081c:
    do {
      lVar14 = lVar9;
      lVar9 = lVar14 + 1;
      lVar16 = 1;
      iVar5 = 2;
      do {
        lVar16 = lVar16 * lVar9;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    } while (lVar16 - x / lVar9 == 0 || lVar16 < x / lVar9);
    piVar12 = (int128_t *)(long)(local_1c8 * (double)lVar14);
    local_1c0 = x / (long)piVar12;
    local_1b8 = 6;
    if ((long)piVar12 < 0xd) {
      local_1b8 = (uint64_t)*(int *)(PhiTiny::pi + (long)piVar12 * 4);
    }
    paVar1 = &local_1e8.field_2;
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"");
    print(&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"=== pi_lmo5(x) ===","");
    print(&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,"pi(x) = S1 + S2 + pi(y) - 1 - P2","");
    print(&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    x_01._8_8_ = in_stack_fffffffffffffe00;
    x_01._0_8_ = in_stack_fffffffffffffdf8;
    print((primesum *)x,(int128_t)x_01,0,(int64_t)piVar12,local_1c0,local_1c8,(int)local_1b8);
    x_02._8_8_ = in_stack_fffffffffffffe00;
    x_02._0_8_ = in_stack_fffffffffffffdf8;
    P2(&local_58,(primesum *)x,(int128_t)x_02,0,(int)piVar12);
    generate_moebius(&local_b0,(int64_t)piVar12);
    generate_lpf(&local_c8,(int64_t)piVar12);
    generate_primes(&local_198,(int64_t)piVar12);
    x_03._8_8_ = in_stack_fffffffffffffe00;
    x_03._0_8_ = in_stack_fffffffffffffdf8;
    S1(&local_78,(primesum *)x,(int128_t)x_03,0,(int64_t)piVar12,(int)local_1b8);
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_allocated_capacity =
         local_1e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    print(&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    local_150._M_dataplus._M_p = (pointer)0x10;
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    local_1e8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_1e8,(ulong)&local_150);
    local_1e8.field_2._M_allocated_capacity = (size_type)local_150._M_dataplus._M_p;
    builtin_strncpy(local_1e8._M_dataplus._M_p,"=== S2(x, y) ===",0x10);
    local_1e8._M_string_length = (size_type)local_150._M_dataplus._M_p;
    local_1e8._M_dataplus._M_p[(long)local_150._M_dataplus._M_p] = '\0';
    print(&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    local_150._M_dataplus._M_p = (pointer)0x21;
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    local_1e8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_1e8,(ulong)&local_150);
    local_1e8.field_2._M_allocated_capacity = (size_type)local_150._M_dataplus._M_p;
    builtin_strncpy(local_1e8._M_dataplus._M_p,"Computation of the special leaves",0x21);
    local_1e8._M_string_length = (size_type)local_150._M_dataplus._M_p;
    local_1e8._M_dataplus._M_p[(long)local_150._M_dataplus._M_p] = '\0';
    print(&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    local_100 = get_time();
    c = local_1b8;
    uVar17 = local_1c0 + 1;
    dVar3 = (double)(long)uVar17;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    lVar9 = 0xb504f333;
    if ((long)dVar3 < 0xb504f333) {
      lVar9 = (long)dVar3;
    }
    lVar14 = lVar9 * 2;
    do {
      lVar10 = lVar9 * lVar9;
      lVar14 = lVar14 + -2;
      lVar16 = lVar9;
      lVar9 = lVar9 + -1;
    } while (lVar10 - uVar17 != 0 && (long)uVar17 <= lVar10);
    do {
      lVar9 = lVar16;
      lVar14 = lVar14 + 2;
      lVar16 = lVar9 + 1;
    } while (lVar14 < (long)(uVar17 - lVar9 * lVar9));
    size = 1;
    if (lVar9 + 1 != 1) {
      uVar7 = lVar9 - 1;
      lVar9 = 1;
      do {
        uVar7 = (long)uVar7 >> ((byte)lVar9 & 0x3f) | uVar7;
        bVar2 = lVar9 < 0x20;
        lVar9 = lVar9 * 2;
      } while (bVar2);
      size = uVar7 + 1;
    }
    BitSieve::BitSieve((BitSieve *)&local_1e8,size);
    Wheel::Wheel<std::vector<int,std::allocator<int>>>
              (&local_118,&local_198,
               (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,1);
    generate_pi(&local_130,(int64_t)piVar12);
    local_150._M_dataplus._M_p = (pointer)0x0;
    std::vector<long,_std::allocator<long>_>::vector
              (&local_168,
               (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(value_type_conflict7 *)&local_150,
               (allocator_type *)&local_98);
    dVar3 = (double)(long)piVar12;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    lVar9 = 0xb504f333;
    if ((long)dVar3 < 0xb504f333) {
      lVar9 = (long)dVar3;
    }
    lVar14 = lVar9 * 2;
    do {
      lVar16 = lVar9 * lVar9;
      lVar9 = lVar9 + -1;
      lVar14 = lVar14 + -2;
    } while (lVar16 - (long)piVar12 != 0 && (long)piVar12 <= lVar16);
    do {
      lVar9 = lVar9 + 1;
      x_04 = (long)piVar12 - lVar9 * lVar9;
      lVar14 = lVar14 + 2;
    } while (lVar14 < (long)x_04);
    if (local_1c0 < 1) {
      local_1a0 = 0;
    }
    else {
      local_d8 = (long)*(int *)((long)local_130.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar14 * 2);
      local_180 = (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)piVar12];
      local_1a0 = 0;
      low = 1;
      local_1c8 = (double)x;
      local_178 = piVar12;
      local_f8 = size;
      local_f0 = uVar17;
      do {
        local_e8 = low + local_f8;
        uVar17 = local_e8;
        if ((long)local_f0 < (long)local_e8) {
          uVar17 = local_f0;
        }
        x_04 = c;
        BitSieve::pre_sieve((BitSieve *)&local_1e8,c,low);
        local_170 = uVar17 - low;
        local_1b0 = uVar17;
        do {
          piVar4 = local_178;
          dVar3 = local_1c8;
          c = c + 1;
          if (local_d8 <= (long)c) goto LAB_00120ebe;
          iVar5 = local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[c];
          lVar16 = (long)iVar5;
          lVar14 = x / (long)(uVar17 * lVar16);
          lVar9 = (long)piVar12 / lVar16;
          if ((long)piVar12 / lVar16 < lVar14) {
            lVar9 = lVar14;
          }
          x_04 = low * lVar16;
          piVar8 = (int128_t *)(x / (long)x_04);
          if ((long)piVar12 <= x / (long)x_04) {
            piVar8 = piVar12;
          }
          if (lVar16 < (long)piVar8) {
            if (lVar9 < (long)piVar8) {
              uVar7 = 0;
              local_d0 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              piVar12 = piVar8;
              do {
                iVar6 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)piVar12];
                if (((long)iVar6 != 0) &&
                   (iVar5 < local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[(long)piVar12])) {
                  lVar14 = (long)local_1c8 / ((long)piVar12 * lVar16) - low;
                  if ((long)uVar7 <= lVar14) {
                    lVar10 = local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start[c];
                    do {
                      uVar13 = (&BitSieve::set_bit_)[(uint)uVar7 & 0x7f] &
                               *(ulong *)(local_1e8._M_dataplus._M_p + (uVar7 >> 7) * 8);
                      if (uVar13 != 0) {
                        uVar13 = low + uVar7;
                      }
                      lVar10 = lVar10 + uVar13;
                      local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[c] = lVar10;
                      uVar7 = uVar7 + 2;
                    } while ((long)uVar7 <= lVar14);
                  }
                  local_1a0 = local_1a0 -
                              (long)piVar12 * lVar16 * (long)iVar6 *
                              local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start[c];
                }
                piVar12 = (int128_t *)((long)piVar12 + -1);
              } while (lVar9 < (long)piVar12);
            }
            else {
              uVar7 = 0;
            }
            if ((long)uVar7 < local_170) {
              lVar9 = local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[c];
              do {
                uVar13 = (&BitSieve::set_bit_)[(uint)uVar7 & 0x7f] &
                         *(ulong *)(local_1e8._M_dataplus._M_p + (uVar7 >> 7) * 8);
                if (uVar13 != 0) {
                  uVar13 = low + uVar7;
                }
                lVar9 = lVar9 + uVar13;
                local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start[c] = lVar9;
                uVar7 = uVar7 + 2;
              } while ((long)uVar7 < local_170);
            }
            x_04 = low;
            local_1a8 = lVar16;
            local_e0 = piVar8;
            anon_unknown.dwarf_e0d9d::cross_off
                      ((BitSieve *)&local_1e8,low,local_1b0,lVar16,
                       local_118.wheel_.
                       super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                       ._M_impl.super__Vector_impl_data._M_start + c);
            piVar8 = local_e0;
            piVar12 = piVar4;
            x = (int64_t)dVar3;
            uVar17 = local_1b0;
          }
        } while (lVar16 < (long)piVar8);
LAB_00121034:
        c = local_1b8;
        low = local_e8;
      } while ((long)local_e8 <= local_1c0);
    }
    lVar9 = local_1a0;
    local_150.field_2._M_allocated_capacity._0_2_ = 0x3253;
    local_150._M_string_length = 2;
    local_150.field_2._M_local_buf[2] = '\0';
    local_98 = local_1a0;
    lStack_90 = local_1a0 >> 0x3f;
    res.high._0_8_ = lStack_90;
    res.low = (uint128_t)SEXT816(local_1a0);
    res.high._8_8_ = lStack_90;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    local_88 = lStack_90;
    lStack_80 = lStack_90;
    print(&local_150,res,local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      x_04 = CONCAT53(local_150.field_2._M_allocated_capacity._3_5_,
                      CONCAT12(local_150.field_2._M_local_buf[2],
                               local_150.field_2._M_allocated_capacity._0_2_)) + 1;
      operator_delete(local_150._M_dataplus._M_p,x_04);
    }
    if (local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      x_04 = (long)local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
      operator_delete(local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,x_04);
    }
    if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      x_04 = (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
      operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,x_04);
    }
    if (local_118.wheel_.
        super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      x_04 = (long)local_118.wheel_.
                   super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)local_118.wheel_.
                   super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      operator_delete(local_118.wheel_.
                      super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>.
                      _M_impl.super__Vector_impl_data._M_start,x_04);
    }
    if (local_1e8._M_dataplus._M_p != (char *)0x0) {
      x_04 = local_1e8.field_2._M_allocated_capacity - (long)local_1e8._M_dataplus._M_p;
      operator_delete(local_1e8._M_dataplus._M_p,x_04);
    }
    piVar12 = prime_sum_tiny(piVar12,x_04);
    if (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar18 = (long)piVar12 + ~(ulong)local_58.low + (long)local_78.low + lVar9;
  }
  return iVar18;
LAB_00120ebe:
  piVar4 = local_178;
  dVar3 = local_1c8;
  if (local_180 <= (long)c) goto LAB_00121034;
  iVar5 = local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[c];
  uVar7 = (ulong)iVar5;
  piVar8 = (int128_t *)(x / (long)(low * uVar7));
  if ((long)piVar12 <= (long)piVar8) {
    piVar8 = piVar12;
  }
  lVar9 = (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)piVar8];
  x_04 = x / (long)(uVar17 * uVar7);
  uVar13 = (long)piVar12 / (long)uVar7;
  if ((long)piVar12 / (long)uVar7 <= (long)uVar7) {
    uVar13 = uVar7;
  }
  if ((long)uVar13 <= (long)x_04) {
    uVar13 = x_04;
  }
  iVar6 = local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar9];
  lVar14 = (long)iVar6;
  if (iVar5 < iVar6) {
    if ((long)uVar13 < lVar14) {
      lVar16 = local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start[c];
      uVar15 = 0;
      lVar10 = lVar14;
      do {
        for (; (long)uVar15 <= (long)((long)local_1c8 / (long)(lVar10 * uVar7) - low);
            uVar15 = uVar15 + 2) {
          uVar11 = (&BitSieve::set_bit_)[(uint)uVar15 & 0x7f] &
                   *(ulong *)(local_1e8._M_dataplus._M_p + (uVar15 >> 7) * 8);
          if (uVar11 != 0) {
            uVar11 = low + uVar15;
          }
          lVar16 = lVar16 + uVar11;
          local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[c] = lVar16;
        }
        local_1a0 = local_1a0 + lVar10 * uVar7 * lVar16;
        lVar10 = (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar9 + -1];
        lVar9 = lVar9 + -1;
      } while ((long)uVar13 < lVar10);
    }
    else {
      uVar15 = 0;
    }
    if ((long)uVar15 < local_170) {
      lVar9 = local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start[c];
      do {
        uVar13 = (&BitSieve::set_bit_)[(uint)uVar15 & 0x7f] &
                 *(ulong *)(local_1e8._M_dataplus._M_p + (uVar15 >> 7) * 8);
        if (uVar13 != 0) {
          uVar13 = low + uVar15;
        }
        lVar9 = lVar9 + uVar13;
        local_168.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start[c] = lVar9;
        uVar15 = uVar15 + 2;
      } while ((long)uVar15 < local_170);
    }
    x_04 = low;
    local_1a8 = lVar14;
    anon_unknown.dwarf_e0d9d::cross_off
              ((BitSieve *)&local_1e8,low,local_1b0,uVar7,
               local_118.wheel_.
               super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>._M_impl
               .super__Vector_impl_data._M_start + c);
    iVar6 = (int)local_1a8;
    piVar12 = piVar4;
    x = (int64_t)dVar3;
    uVar17 = local_1b0;
  }
  if (iVar6 <= iVar5) goto LAB_00121034;
  c = c + 1;
  goto LAB_00120ebe;
}

Assistant:

int64_t pi_lmo5(int64_t x)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t z = x / y;
  int64_t c = PhiTiny::get_c(y);

  print("");
  print("=== pi_lmo5(x) ===");
  print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
  print(x, y, z, c, alpha, 1);

  int256_t p2 = P2(x, y, 1);
  vector<int32_t> mu = generate_moebius(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> primes = generate_primes(y);

  int256_t s1 = S1(x, y, c, 1);
  int256_t s2 = S2(x, y, c, primes, lpf, mu);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return int64_t(sum);
}